

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O0

UnicodeString *
icu_63::number::impl::PatternStringUtils::propertiesToPatternString
          (UnicodeString *__return_storage_ptr__,DecimalFormatProperties *properties,
          UErrorCode *status)

{
  bool bVar1;
  UBool UVar2;
  bool bVar3;
  digits_t dVar4;
  char16_t cVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t x;
  int32_t iVar9;
  int32_t iVar10;
  int32_t iVar11;
  int32_t iVar12;
  int32_t iVar13;
  int32_t iVar14;
  int iVar15;
  UNumberFormatPadPosition UVar16;
  int32_t local_6bc;
  int local_6b4;
  UnicodeString local_618;
  undefined1 local_5d8 [8];
  UnicodeString copy;
  UnicodeString local_550;
  UnicodeString local_510;
  UnicodeString local_4d0;
  UnicodeString local_490;
  int local_44c;
  undefined1 local_448 [4];
  int addedLength;
  int32_t local_408;
  int local_404;
  int beforeSuffixPos;
  int i;
  int di;
  int magnitude;
  int mN;
  int m0;
  UnicodeString str;
  DecimalQuantity incrementQuantity;
  undefined1 local_358 [4];
  int digitsStringScale;
  UnicodeString digitsString;
  double roundingInterval;
  int32_t local_308;
  int groupingLength;
  int grouping;
  int grouping2;
  int grouping1;
  int afterPrefixPos;
  undefined1 local_2b8 [8];
  UnicodeString nsp;
  UnicodeString ns;
  UnicodeString npp;
  UnicodeString np;
  UnicodeString psp;
  UnicodeString ps;
  UnicodeString ppp;
  UnicodeString pp;
  bool exponentShowPlusSign;
  int exponentDigits;
  bool alwaysShowDecimal;
  int maxSig;
  int minSig;
  int maxFrac;
  int minFrac;
  int maxInt;
  int minInt;
  UnicodeString paddingString;
  NullableValue<UNumberFormatPadPosition> paddingLocation;
  int paddingWidth;
  int firstGroupingSize;
  int groupingSize;
  int dosMax;
  UErrorCode *status_local;
  DecimalFormatProperties *properties_local;
  UnicodeString *sb;
  
  UnicodeString::UnicodeString(__return_storage_ptr__);
  local_308 = uprv_min_63(properties->secondaryGroupingSize,100);
  iVar6 = uprv_min_63(properties->groupingSize,100);
  iVar7 = uprv_min_63(properties->formatWidth,100);
  paddingString.fUnion._48_8_ = properties->padPosition;
  UnicodeString::UnicodeString((UnicodeString *)&maxInt,&properties->padString);
  iVar8 = uprv_min_63(properties->minimumIntegerDigits,100);
  iVar8 = uprv_max_63(iVar8,0);
  x = uprv_min_63(properties->maximumIntegerDigits,100);
  iVar9 = uprv_min_63(properties->minimumFractionDigits,100);
  iVar9 = uprv_max_63(iVar9,0);
  iVar10 = uprv_min_63(properties->maximumFractionDigits,100);
  iVar11 = uprv_min_63(properties->minimumSignificantDigits,100);
  iVar12 = uprv_min_63(properties->maximumSignificantDigits,100);
  bVar3 = properties->decimalSeparatorAlwaysShown;
  iVar13 = uprv_min_63(properties->minimumExponentDigits,100);
  bVar1 = properties->exponentSignAlwaysShown;
  UnicodeString::UnicodeString
            ((UnicodeString *)((long)&ppp.fUnion + 0x30),&properties->positivePrefix);
  UnicodeString::UnicodeString
            ((UnicodeString *)((long)&ps.fUnion + 0x30),&properties->positivePrefixPattern);
  UnicodeString::UnicodeString
            ((UnicodeString *)((long)&psp.fUnion + 0x30),&properties->positiveSuffix);
  UnicodeString::UnicodeString
            ((UnicodeString *)((long)&np.fUnion + 0x30),&properties->positiveSuffixPattern);
  UnicodeString::UnicodeString
            ((UnicodeString *)((long)&npp.fUnion + 0x30),&properties->negativePrefix);
  UnicodeString::UnicodeString
            ((UnicodeString *)((long)&ns.fUnion + 0x30),&properties->negativePrefixPattern);
  UnicodeString::UnicodeString
            ((UnicodeString *)((long)&nsp.fUnion + 0x30),&properties->negativeSuffix);
  UnicodeString::UnicodeString((UnicodeString *)local_2b8,&properties->negativeSuffixPattern);
  UVar2 = UnicodeString::isBogus((UnicodeString *)((long)&ps.fUnion + 0x30));
  if (UVar2 == '\0') {
    UnicodeString::append(__return_storage_ptr__,(UnicodeString *)((long)&ps.fUnion + 0x30));
  }
  AffixUtils::escape((UnicodeString *)&grouping1,(UnicodeString *)((long)&ppp.fUnion + 0x30));
  UnicodeString::append(__return_storage_ptr__,(UnicodeString *)&grouping1);
  UnicodeString::~UnicodeString((UnicodeString *)&grouping1);
  grouping2 = UnicodeString::length(__return_storage_ptr__);
  iVar14 = uprv_min_63(100,-1);
  if (((local_308 == iVar14) || (iVar14 = uprv_min_63(100,-1), iVar6 == iVar14)) ||
     (groupingLength = iVar6, grouping = local_308, local_308 == iVar6)) {
    iVar14 = uprv_min_63(100,-1);
    groupingLength = local_308;
    if ((local_308 == iVar14) &&
       (iVar14 = uprv_min_63(100,-1), groupingLength = iVar6, iVar6 == iVar14)) {
      local_308 = 0;
      groupingLength = 0;
    }
    grouping = 0;
  }
  digitsString.fUnion._48_8_ = properties->roundingIncrement;
  UnicodeString::UnicodeString((UnicodeString *)local_358);
  incrementQuantity._76_4_ = 0;
  iVar6 = uprv_min_63(100,-1);
  if (iVar12 == iVar6) {
    if (((double)digitsString.fUnion._48_8_ != 0.0) || (NAN((double)digitsString.fUnion._48_8_))) {
      dVar4 = roundingutils::doubleFractionLength((double)digitsString.fUnion._48_8_);
      incrementQuantity._76_4_ = -(int)dVar4;
      DecimalQuantity::DecimalQuantity((DecimalQuantity *)((long)&str.fUnion + 0x30));
      DecimalQuantity::setToDouble
                ((DecimalQuantity *)((long)&str.fUnion + 0x30),(double)digitsString.fUnion._48_8_);
      DecimalQuantity::adjustMagnitude((DecimalQuantity *)((long)&str.fUnion + 0x30),(int)dVar4);
      DecimalQuantity::roundToMagnitude
                ((DecimalQuantity *)((long)&str.fUnion + 0x30),0,UNUM_FOUND_HALFEVEN,status);
      DecimalQuantity::toPlainString
                ((UnicodeString *)&mN,(DecimalQuantity *)((long)&str.fUnion + 0x30));
      cVar5 = UnicodeString::charAt((UnicodeString *)&mN,0);
      if (cVar5 == L'-') {
        iVar6 = UnicodeString::length((UnicodeString *)&mN);
        UnicodeString::append((UnicodeString *)local_358,(UnicodeString *)&mN,1,iVar6 + -1);
      }
      else {
        UnicodeString::append((UnicodeString *)local_358,(UnicodeString *)&mN);
      }
      UnicodeString::~UnicodeString((UnicodeString *)&mN);
      DecimalQuantity::~DecimalQuantity((DecimalQuantity *)((long)&str.fUnion + 0x30));
    }
  }
  else {
    while (iVar6 = UnicodeString::length((UnicodeString *)local_358), iVar6 < iVar11) {
      UnicodeString::append((UnicodeString *)local_358,L'@');
    }
    while (iVar6 = UnicodeString::length((UnicodeString *)local_358), iVar6 < iVar12) {
      UnicodeString::append((UnicodeString *)local_358,L'#');
    }
  }
  while (iVar6 = UnicodeString::length((UnicodeString *)local_358),
        iVar6 + incrementQuantity._76_4_ < iVar8) {
    UnicodeString::insert((UnicodeString *)local_358,0,L'0');
  }
  for (; (int)-incrementQuantity._76_4_ < iVar9;
      incrementQuantity._76_4_ = incrementQuantity._76_4_ + -1) {
    UnicodeString::append((UnicodeString *)local_358,L'0');
  }
  iVar6 = UnicodeString::length((UnicodeString *)local_358);
  magnitude = uprv_max_63(grouping + 1 + groupingLength,iVar6 + incrementQuantity._76_4_);
  if (x != 100) {
    magnitude = uprv_max_63(x,magnitude);
  }
  local_6b4 = magnitude + -1;
  magnitude = local_6b4;
  if (iVar10 == 100) {
    local_6bc = incrementQuantity._76_4_;
  }
  else {
    local_6bc = uprv_min_63(-iVar10,incrementQuantity._76_4_);
  }
  di = local_6bc;
  for (i = magnitude; di <= i; i = i + -1) {
    iVar6 = UnicodeString::length((UnicodeString *)local_358);
    iVar15 = ((iVar6 + incrementQuantity._76_4_) - i) + -1;
    beforeSuffixPos = iVar15;
    if ((iVar15 < 0) || (iVar6 = UnicodeString::length((UnicodeString *)local_358), iVar6 <= iVar15)
       ) {
      UnicodeString::append(__return_storage_ptr__,L'#');
    }
    else {
      cVar5 = UnicodeString::charAt((UnicodeString *)local_358,beforeSuffixPos);
      UnicodeString::append(__return_storage_ptr__,cVar5);
    }
    if (((groupingLength < i) && (0 < local_308)) && ((i - groupingLength) % local_308 == 0)) {
      UnicodeString::append(__return_storage_ptr__,L',');
    }
    else if ((i < 1) || (i != groupingLength)) {
      if ((i == 0) && (((bVar3 & 1U) != 0 || (di < 0)))) {
        UnicodeString::append(__return_storage_ptr__,L'.');
      }
    }
    else {
      UnicodeString::append(__return_storage_ptr__,L',');
    }
  }
  iVar6 = uprv_min_63(100,-1);
  if (iVar13 != iVar6) {
    UnicodeString::append(__return_storage_ptr__,L'E');
    if ((bVar1 & 1U) != 0) {
      UnicodeString::append(__return_storage_ptr__,L'+');
    }
    for (local_404 = 0; local_404 < iVar13; local_404 = local_404 + 1) {
      UnicodeString::append(__return_storage_ptr__,L'0');
    }
  }
  local_408 = UnicodeString::length(__return_storage_ptr__);
  UVar2 = UnicodeString::isBogus((UnicodeString *)((long)&np.fUnion + 0x30));
  if (UVar2 == '\0') {
    UnicodeString::append(__return_storage_ptr__,(UnicodeString *)((long)&np.fUnion + 0x30));
  }
  AffixUtils::escape((UnicodeString *)local_448,(UnicodeString *)((long)&psp.fUnion + 0x30));
  UnicodeString::append(__return_storage_ptr__,(UnicodeString *)local_448);
  UnicodeString::~UnicodeString((UnicodeString *)local_448);
  if ((iVar7 != -1) &&
     (bVar3 = NullableValue<UNumberFormatPadPosition>::isNull
                        ((NullableValue<UNumberFormatPadPosition> *)
                         ((long)&paddingString.fUnion + 0x30)), !bVar3)) {
    while (iVar6 = UnicodeString::length(__return_storage_ptr__), 0 < iVar7 - iVar6) {
      UnicodeString::insert(__return_storage_ptr__,grouping2,L'#');
      local_408 = local_408 + 1;
    }
    UVar16 = NullableValue<UNumberFormatPadPosition>::get
                       ((NullableValue<UNumberFormatPadPosition> *)
                        ((long)&paddingString.fUnion + 0x30),status);
    switch(UVar16) {
    case UNUM_PAD_BEFORE_PREFIX:
      UnicodeString::UnicodeString(&local_490,(UnicodeString *)&maxInt);
      local_44c = escapePaddingString(&local_490,__return_storage_ptr__,0,status);
      UnicodeString::~UnicodeString(&local_490);
      UnicodeString::insert(__return_storage_ptr__,0,L'*');
      grouping2 = local_44c + 1 + grouping2;
      local_408 = local_44c + 1 + local_408;
      break;
    case UNUM_PAD_AFTER_PREFIX:
      UnicodeString::UnicodeString(&local_4d0,(UnicodeString *)&maxInt);
      local_44c = escapePaddingString(&local_4d0,__return_storage_ptr__,grouping2,status);
      UnicodeString::~UnicodeString(&local_4d0);
      UnicodeString::insert(__return_storage_ptr__,grouping2,L'*');
      grouping2 = local_44c + 1 + grouping2;
      local_408 = local_44c + 1 + local_408;
      break;
    case UNUM_PAD_BEFORE_SUFFIX:
      UnicodeString::UnicodeString(&local_510,(UnicodeString *)&maxInt);
      escapePaddingString(&local_510,__return_storage_ptr__,local_408,status);
      UnicodeString::~UnicodeString(&local_510);
      UnicodeString::insert(__return_storage_ptr__,local_408,L'*');
      break;
    case UNUM_PAD_AFTER_SUFFIX:
      UnicodeString::append(__return_storage_ptr__,L'*');
      UnicodeString::UnicodeString(&local_550,(UnicodeString *)&maxInt);
      iVar6 = UnicodeString::length(__return_storage_ptr__);
      escapePaddingString(&local_550,__return_storage_ptr__,iVar6,status);
      UnicodeString::~UnicodeString(&local_550);
    }
    UVar2 = ::U_FAILURE(*status);
    if (UVar2 != '\0') goto LAB_002e3fe6;
  }
  UVar2 = UnicodeString::isBogus((UnicodeString *)((long)&npp.fUnion + 0x30));
  if ((((UVar2 == '\0') ||
       (UVar2 = UnicodeString::isBogus((UnicodeString *)((long)&nsp.fUnion + 0x30)), UVar2 == '\0'))
      || ((UVar2 = UnicodeString::isBogus((UnicodeString *)((long)&ns.fUnion + 0x30)), UVar2 != '\0'
          && (UVar2 = UnicodeString::isBogus((UnicodeString *)local_2b8), UVar2 == '\0')))) ||
     ((UVar2 = UnicodeString::isBogus((UnicodeString *)((long)&ns.fUnion + 0x30)), UVar2 == '\0' &&
      (((iVar6 = UnicodeString::length((UnicodeString *)((long)&ns.fUnion + 0x30)), iVar6 != 1 ||
        (cVar5 = UnicodeString::charAt((UnicodeString *)((long)&ns.fUnion + 0x30),0), cVar5 != L'-')
        ) || (iVar6 = UnicodeString::length((UnicodeString *)local_2b8), iVar6 != 0)))))) {
    UnicodeString::append(__return_storage_ptr__,L';');
    UVar2 = UnicodeString::isBogus((UnicodeString *)((long)&ns.fUnion + 0x30));
    if (UVar2 == '\0') {
      UnicodeString::append(__return_storage_ptr__,(UnicodeString *)((long)&ns.fUnion + 0x30));
    }
    AffixUtils::escape((UnicodeString *)((long)&copy.fUnion + 0x30),
                       (UnicodeString *)((long)&npp.fUnion + 0x30));
    UnicodeString::append(__return_storage_ptr__,(UnicodeString *)((long)&copy.fUnion + 0x30));
    UnicodeString::~UnicodeString((UnicodeString *)((long)&copy.fUnion + 0x30));
    UnicodeString::UnicodeString((UnicodeString *)local_5d8,__return_storage_ptr__);
    UnicodeString::append
              (__return_storage_ptr__,(UnicodeString *)local_5d8,grouping2,local_408 - grouping2);
    UVar2 = UnicodeString::isBogus((UnicodeString *)local_2b8);
    if (UVar2 == '\0') {
      UnicodeString::append(__return_storage_ptr__,(UnicodeString *)local_2b8);
    }
    AffixUtils::escape(&local_618,(UnicodeString *)((long)&nsp.fUnion + 0x30));
    UnicodeString::append(__return_storage_ptr__,&local_618);
    UnicodeString::~UnicodeString(&local_618);
    UnicodeString::~UnicodeString((UnicodeString *)local_5d8);
  }
LAB_002e3fe6:
  UnicodeString::~UnicodeString((UnicodeString *)local_358);
  UnicodeString::~UnicodeString((UnicodeString *)local_2b8);
  UnicodeString::~UnicodeString((UnicodeString *)((long)&nsp.fUnion + 0x30));
  UnicodeString::~UnicodeString((UnicodeString *)((long)&ns.fUnion + 0x30));
  UnicodeString::~UnicodeString((UnicodeString *)((long)&npp.fUnion + 0x30));
  UnicodeString::~UnicodeString((UnicodeString *)((long)&np.fUnion + 0x30));
  UnicodeString::~UnicodeString((UnicodeString *)((long)&psp.fUnion + 0x30));
  UnicodeString::~UnicodeString((UnicodeString *)((long)&ps.fUnion + 0x30));
  UnicodeString::~UnicodeString((UnicodeString *)((long)&ppp.fUnion + 0x30));
  UnicodeString::~UnicodeString((UnicodeString *)&maxInt);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString PatternStringUtils::propertiesToPatternString(const DecimalFormatProperties& properties,
                                                            UErrorCode& status) {
    UnicodeString sb;

    // Convenience references
    // The uprv_min() calls prevent DoS
    int dosMax = 100;
    int groupingSize = uprv_min(properties.secondaryGroupingSize, dosMax);
    int firstGroupingSize = uprv_min(properties.groupingSize, dosMax);
    int paddingWidth = uprv_min(properties.formatWidth, dosMax);
    NullableValue<PadPosition> paddingLocation = properties.padPosition;
    UnicodeString paddingString = properties.padString;
    int minInt = uprv_max(uprv_min(properties.minimumIntegerDigits, dosMax), 0);
    int maxInt = uprv_min(properties.maximumIntegerDigits, dosMax);
    int minFrac = uprv_max(uprv_min(properties.minimumFractionDigits, dosMax), 0);
    int maxFrac = uprv_min(properties.maximumFractionDigits, dosMax);
    int minSig = uprv_min(properties.minimumSignificantDigits, dosMax);
    int maxSig = uprv_min(properties.maximumSignificantDigits, dosMax);
    bool alwaysShowDecimal = properties.decimalSeparatorAlwaysShown;
    int exponentDigits = uprv_min(properties.minimumExponentDigits, dosMax);
    bool exponentShowPlusSign = properties.exponentSignAlwaysShown;
    UnicodeString pp = properties.positivePrefix;
    UnicodeString ppp = properties.positivePrefixPattern;
    UnicodeString ps = properties.positiveSuffix;
    UnicodeString psp = properties.positiveSuffixPattern;
    UnicodeString np = properties.negativePrefix;
    UnicodeString npp = properties.negativePrefixPattern;
    UnicodeString ns = properties.negativeSuffix;
    UnicodeString nsp = properties.negativeSuffixPattern;

    // Prefixes
    if (!ppp.isBogus()) {
        sb.append(ppp);
    }
    sb.append(AffixUtils::escape(pp));
    int afterPrefixPos = sb.length();

    // Figure out the grouping sizes.
    int grouping1, grouping2, grouping;
    if (groupingSize != uprv_min(dosMax, -1) && firstGroupingSize != uprv_min(dosMax, -1) &&
        groupingSize != firstGroupingSize) {
        grouping = groupingSize;
        grouping1 = groupingSize;
        grouping2 = firstGroupingSize;
    } else if (groupingSize != uprv_min(dosMax, -1)) {
        grouping = groupingSize;
        grouping1 = 0;
        grouping2 = groupingSize;
    } else if (firstGroupingSize != uprv_min(dosMax, -1)) {
        grouping = groupingSize;
        grouping1 = 0;
        grouping2 = firstGroupingSize;
    } else {
        grouping = 0;
        grouping1 = 0;
        grouping2 = 0;
    }
    int groupingLength = grouping1 + grouping2 + 1;

    // Figure out the digits we need to put in the pattern.
    double roundingInterval = properties.roundingIncrement;
    UnicodeString digitsString;
    int digitsStringScale = 0;
    if (maxSig != uprv_min(dosMax, -1)) {
        // Significant Digits.
        while (digitsString.length() < minSig) {
            digitsString.append(u'@');
        }
        while (digitsString.length() < maxSig) {
            digitsString.append(u'#');
        }
    } else if (roundingInterval != 0.0) {
        // Rounding Interval.
        digitsStringScale = -roundingutils::doubleFractionLength(roundingInterval);
        // TODO: Check for DoS here?
        DecimalQuantity incrementQuantity;
        incrementQuantity.setToDouble(roundingInterval);
        incrementQuantity.adjustMagnitude(-digitsStringScale);
        incrementQuantity.roundToMagnitude(0, kDefaultMode, status);
        UnicodeString str = incrementQuantity.toPlainString();
        if (str.charAt(0) == u'-') {
            // TODO: Unsupported operation exception or fail silently?
            digitsString.append(str, 1, str.length() - 1);
        } else {
            digitsString.append(str);
        }
    }
    while (digitsString.length() + digitsStringScale < minInt) {
        digitsString.insert(0, u'0');
    }
    while (-digitsStringScale < minFrac) {
        digitsString.append(u'0');
        digitsStringScale--;
    }

    // Write the digits to the string builder
    int m0 = uprv_max(groupingLength, digitsString.length() + digitsStringScale);
    m0 = (maxInt != dosMax) ? uprv_max(maxInt, m0) - 1 : m0 - 1;
    int mN = (maxFrac != dosMax) ? uprv_min(-maxFrac, digitsStringScale) : digitsStringScale;
    for (int magnitude = m0; magnitude >= mN; magnitude--) {
        int di = digitsString.length() + digitsStringScale - magnitude - 1;
        if (di < 0 || di >= digitsString.length()) {
            sb.append(u'#');
        } else {
            sb.append(digitsString.charAt(di));
        }
        if (magnitude > grouping2 && grouping > 0 && (magnitude - grouping2) % grouping == 0) {
            sb.append(u',');
        } else if (magnitude > 0 && magnitude == grouping2) {
            sb.append(u',');
        } else if (magnitude == 0 && (alwaysShowDecimal || mN < 0)) {
            sb.append(u'.');
        }
    }

    // Exponential notation
    if (exponentDigits != uprv_min(dosMax, -1)) {
        sb.append(u'E');
        if (exponentShowPlusSign) {
            sb.append(u'+');
        }
        for (int i = 0; i < exponentDigits; i++) {
            sb.append(u'0');
        }
    }

    // Suffixes
    int beforeSuffixPos = sb.length();
    if (!psp.isBogus()) {
        sb.append(psp);
    }
    sb.append(AffixUtils::escape(ps));

    // Resolve Padding
    if (paddingWidth != -1 && !paddingLocation.isNull()) {
        while (paddingWidth - sb.length() > 0) {
            sb.insert(afterPrefixPos, u'#');
            beforeSuffixPos++;
        }
        int addedLength;
        switch (paddingLocation.get(status)) {
            case PadPosition::UNUM_PAD_BEFORE_PREFIX:
                addedLength = escapePaddingString(paddingString, sb, 0, status);
                sb.insert(0, u'*');
                afterPrefixPos += addedLength + 1;
                beforeSuffixPos += addedLength + 1;
                break;
            case PadPosition::UNUM_PAD_AFTER_PREFIX:
                addedLength = escapePaddingString(paddingString, sb, afterPrefixPos, status);
                sb.insert(afterPrefixPos, u'*');
                afterPrefixPos += addedLength + 1;
                beforeSuffixPos += addedLength + 1;
                break;
            case PadPosition::UNUM_PAD_BEFORE_SUFFIX:
                escapePaddingString(paddingString, sb, beforeSuffixPos, status);
                sb.insert(beforeSuffixPos, u'*');
                break;
            case PadPosition::UNUM_PAD_AFTER_SUFFIX:
                sb.append(u'*');
                escapePaddingString(paddingString, sb, sb.length(), status);
                break;
        }
        if (U_FAILURE(status)) { return sb; }
    }

    // Negative affixes
    // Ignore if the negative prefix pattern is "-" and the negative suffix is empty
    if (!np.isBogus() || !ns.isBogus() || (npp.isBogus() && !nsp.isBogus()) ||
        (!npp.isBogus() && (npp.length() != 1 || npp.charAt(0) != u'-' || nsp.length() != 0))) {
        sb.append(u';');
        if (!npp.isBogus()) {
            sb.append(npp);
        }
        sb.append(AffixUtils::escape(np));
        // Copy the positive digit format into the negative.
        // This is optional; the pattern is the same as if '#' were appended here instead.
        // NOTE: It is not safe to append the UnicodeString to itself, so we need to copy.
        // See http://bugs.icu-project.org/trac/ticket/13707
        UnicodeString copy(sb);
        sb.append(copy, afterPrefixPos, beforeSuffixPos - afterPrefixPos);
        if (!nsp.isBogus()) {
            sb.append(nsp);
        }
        sb.append(AffixUtils::escape(ns));
    }

    return sb;
}